

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O1

void VP8LTransformColorInverse_C(VP8LMultipliers *m,uint32_t *src,int num_pixels,uint32_t *dst)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  
  if (0 < num_pixels) {
    uVar1 = m->green_to_red;
    uVar2 = m->green_to_blue;
    uVar3 = m->red_to_blue;
    uVar7 = 0;
    do {
      uVar4 = src[uVar7];
      iVar5 = (int)(char)(uVar4 >> 8);
      bVar6 = (char)(iVar5 * (char)uVar1 >> 5) + (char)(uVar4 >> 0x10);
      dst[uVar7] = (uint)bVar6 << 0x10 | uVar4 & 0xff00ff00 |
                   ((uint)((int)(char)bVar6 * (int)(char)uVar3) >> 5) +
                   ((uint)(iVar5 * (char)uVar2) >> 5) + uVar4 & 0xff;
      uVar7 = uVar7 + 1;
    } while ((uint)num_pixels != uVar7);
  }
  return;
}

Assistant:

void VP8LTransformColorInverse_C(const VP8LMultipliers* const m,
                                 const uint32_t* src, int num_pixels,
                                 uint32_t* dst) {
  int i;
  for (i = 0; i < num_pixels; ++i) {
    const uint32_t argb = src[i];
    const int8_t green = (int8_t)(argb >> 8);
    const uint32_t red = argb >> 16;
    int new_red = red & 0xff;
    int new_blue = argb & 0xff;
    new_red += ColorTransformDelta((int8_t)m->green_to_red, green);
    new_red &= 0xff;
    new_blue += ColorTransformDelta((int8_t)m->green_to_blue, green);
    new_blue += ColorTransformDelta((int8_t)m->red_to_blue, (int8_t)new_red);
    new_blue &= 0xff;
    dst[i] = (argb & 0xff00ff00u) | (new_red << 16) | (new_blue);
  }
}